

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIStaticText.cpp
# Opt level: O2

IGUIFont * __thiscall irr::gui::CGUIStaticText::getActiveFont(CGUIStaticText *this)

{
  long *plVar1;
  IGUIFont *pIVar2;
  undefined1 auVar3 [16];
  
  pIVar2 = this->OverrideFont;
  if (pIVar2 == (IGUIFont *)0x0) {
    auVar3 = (**(code **)(**(long **)&this->field_0x128 + 0x60))();
    plVar1 = auVar3._0_8_;
    if (plVar1 != (long *)0x0) {
      pIVar2 = (IGUIFont *)
               (**(code **)(*plVar1 + 0x30))(plVar1,0,auVar3._8_8_,*(code **)(*plVar1 + 0x30));
      return pIVar2;
    }
    pIVar2 = (IGUIFont *)0x0;
  }
  return pIVar2;
}

Assistant:

IGUIFont *CGUIStaticText::getActiveFont() const
{
	if (OverrideFont)
		return OverrideFont;
	IGUISkin *skin = Environment->getSkin();
	if (skin)
		return skin->getFont();
	return 0;
}